

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::ConstructSourceFileFlags(cmGeneratorTarget *this)

{
  pointer pcVar1;
  int iVar2;
  cmValue cVar3;
  mapped_type *pmVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *relFile;
  pointer pbVar5;
  pointer pbVar6;
  cmSourceFile *pcVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_01;
  cmSourceFile *sf;
  cmList relFiles;
  undefined1 local_68 [32];
  cmList local_48;
  
  if (this->SourceFileFlagsConstructed == false) {
    this->SourceFileFlagsConstructed = true;
    pcVar7 = (cmSourceFile *)(local_68 + 0x10);
    local_68._0_8_ = pcVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"PUBLIC_HEADER","");
    cVar3 = GetProperty(this,(string *)local_68);
    if ((cmSourceFile *)local_68._0_8_ != pcVar7) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if (cVar3.Value != (string *)0x0) {
      pcVar1 = ((cVar3.Value)->_M_dataplus)._M_p;
      local_68._0_8_ = pcVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,pcVar1,pcVar1 + (cVar3.Value)->_M_string_length);
      init._M_len = 1;
      init._M_array = (iterator)local_68;
      cmList::cmList(&local_48,init);
      if ((cmSourceFile *)local_68._0_8_ != pcVar7) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      pbVar6 = local_48.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_48.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar5 = local_48.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_68._0_8_ = cmMakefile::GetSource(this->Makefile,pbVar5,Ambiguous);
          if ((cmSourceFile *)local_68._0_8_ != (cmSourceFile *)0x0) {
            pmVar4 = std::
                     map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                     ::operator[](&this->SourceFlagsMap,(key_type *)local_68);
            pmVar4->MacFolder = "Headers";
            pmVar4->Type = SourceFileTypePublicHeader;
          }
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 != pbVar6);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48.Values);
    }
    pcVar7 = (cmSourceFile *)(local_68 + 0x10);
    local_68._0_8_ = pcVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"PRIVATE_HEADER","");
    cVar3 = GetProperty(this,(string *)local_68);
    if ((cmSourceFile *)local_68._0_8_ != pcVar7) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if (cVar3.Value != (string *)0x0) {
      pcVar1 = ((cVar3.Value)->_M_dataplus)._M_p;
      local_68._0_8_ = pcVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,pcVar1,pcVar1 + (cVar3.Value)->_M_string_length);
      init_00._M_len = 1;
      init_00._M_array = (iterator)local_68;
      cmList::cmList(&local_48,init_00);
      if ((cmSourceFile *)local_68._0_8_ != pcVar7) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      pbVar6 = local_48.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_48.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar5 = local_48.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_68._0_8_ = cmMakefile::GetSource(this->Makefile,pbVar5,Ambiguous);
          if ((cmSourceFile *)local_68._0_8_ != (cmSourceFile *)0x0) {
            pmVar4 = std::
                     map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                     ::operator[](&this->SourceFlagsMap,(key_type *)local_68);
            pmVar4->MacFolder = "PrivateHeaders";
            pmVar4->Type = SourceFileTypePrivateHeader;
          }
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 != pbVar6);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48.Values);
    }
    pcVar7 = (cmSourceFile *)(local_68 + 0x10);
    local_68._0_8_ = pcVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"RESOURCE","");
    cVar3 = GetProperty(this,(string *)local_68);
    if ((cmSourceFile *)local_68._0_8_ != pcVar7) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if (cVar3.Value != (string *)0x0) {
      pcVar1 = ((cVar3.Value)->_M_dataplus)._M_p;
      local_68._0_8_ = pcVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,pcVar1,pcVar1 + (cVar3.Value)->_M_string_length);
      init_01._M_len = 1;
      init_01._M_array = (iterator)local_68;
      cmList::cmList(&local_48,init_01);
      if ((cmSourceFile *)local_68._0_8_ != pcVar7) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      if (local_48.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar6 = local_48.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_68._0_8_ = cmMakefile::GetSource(this->Makefile,pbVar6,Ambiguous);
          if ((cmSourceFile *)local_68._0_8_ != (cmSourceFile *)0x0) {
            pmVar4 = std::
                     map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                     ::operator[](&this->SourceFlagsMap,(key_type *)local_68);
            pmVar4->MacFolder = "";
            iVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x32])
                              (this->GlobalGenerator,this->Makefile);
            if ((char)iVar2 == '\0') {
              pmVar4->MacFolder = "Resources";
            }
            pmVar4->Type = SourceFileTypeResource;
          }
          pbVar6 = pbVar6 + 1;
        } while (pbVar6 != local_48.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48.Values);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::ConstructSourceFileFlags() const
{
  if (this->SourceFileFlagsConstructed) {
    return;
  }
  this->SourceFileFlagsConstructed = true;

  // Process public headers to mark the source files.
  if (cmValue files = this->GetProperty("PUBLIC_HEADER")) {
    cmList relFiles{ *files };
    for (auto const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "Headers";
        flags.Type = cmGeneratorTarget::SourceFileTypePublicHeader;
      }
    }
  }

  // Process private headers after public headers so that they take
  // precedence if a file is listed in both.
  if (cmValue files = this->GetProperty("PRIVATE_HEADER")) {
    cmList relFiles{ *files };
    for (auto const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "PrivateHeaders";
        flags.Type = cmGeneratorTarget::SourceFileTypePrivateHeader;
      }
    }
  }

  // Mark sources listed as resources.
  if (cmValue files = this->GetProperty("RESOURCE")) {
    cmList relFiles{ *files };
    for (auto const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "";
        if (!this->GlobalGenerator->ShouldStripResourcePath(this->Makefile)) {
          flags.MacFolder = "Resources";
        }
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
      }
    }
  }
}